

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

string * duckdb::AttachedDatabase::ExtractDatabaseName
                   (string *__return_storage_ptr__,string *dbpath,FileSystem *fs)

{
  bool bVar1;
  allocator local_19;
  
  if ((dbpath->_M_string_length != 0) && (bVar1 = ::std::operator==(dbpath,":memory:"), !bVar1)) {
    FileSystem::ExtractBaseName((string *)__return_storage_ptr__,fs,(string *)dbpath);
    bVar1 = NameIsReserved(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"memory",&local_19);
  return __return_storage_ptr__;
}

Assistant:

string AttachedDatabase::ExtractDatabaseName(const string &dbpath, FileSystem &fs) {
	if (dbpath.empty() || dbpath == IN_MEMORY_PATH) {
		return "memory";
	}
	auto name = fs.ExtractBaseName(dbpath);
	if (NameIsReserved(name)) {
		name += "_db";
	}
	return name;
}